

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O3

void __thiscall
TasGrid::GridLocalPolynomial::addChild<(TasGrid::RuleLocal::erule)2>
          (GridLocalPolynomial *this,int *point,int direction,MultiIndexSet *exclude,
          Data2D<int> *destination)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  vector<int,_std::allocator<int>_> kid;
  allocator_type local_49;
  int *local_48 [2];
  long local_38;
  
  ::std::vector<int,std::allocator<int>>::vector<int_const*,void>
            ((vector<int,std::allocator<int>> *)local_48,point,
             point + (this->super_BaseCanonicalGrid).num_dimensions,&local_49);
  iVar2 = 0;
  bVar1 = true;
  do {
    bVar3 = bVar1;
    iVar2 = RuleLocal::getKid<(TasGrid::RuleLocal::erule)2>(point[direction],iVar2);
    local_48[0][direction] = iVar2;
    if (iVar2 != -1) {
      iVar2 = MultiIndexSet::getSlot(exclude,local_48[0]);
      if (iVar2 == -1) {
        ::std::vector<int,std::allocator<int>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                  ((vector<int,std::allocator<int>> *)&destination->vec,
                   (destination->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,local_48[0],local_48[0] + destination->stride);
        destination->num_strips = destination->num_strips + 1;
      }
    }
    iVar2 = 1;
    bVar1 = false;
  } while (bVar3);
  if (local_48[0] != (int *)0x0) {
    operator_delete(local_48[0],local_38 - (long)local_48[0]);
  }
  return;
}

Assistant:

void GridLocalPolynomial::addChild(const int point[], int direction, const MultiIndexSet &exclude, Data2D<int> &destination) const{
    std::vector<int> kid(point, point + num_dimensions);
    int max_1d_kids = RuleLocal::getMaxNumKids<effrule>();
    for(int i=0; i<max_1d_kids; i++){
        kid[direction] = RuleLocal::getKid<effrule>(point[direction], i);
        if ((kid[direction] != -1) && exclude.missing(kid)){
            destination.appendStrip(kid);
        }
    }
}